

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmainfo.c
# Opt level: O0

char * vma_info(void *ptr)

{
  int iVar1;
  __ssize_t _Var2;
  char *pcVar3;
  FILE *local_58;
  unsigned_long b;
  unsigned_long a;
  size_t line_n;
  char **ppcStack_38;
  uint pairs_cnt;
  char **tmp;
  char **pairs;
  char *line;
  char *buf;
  FILE *fp;
  void *ptr_local;
  
  buf = (char *)0x0;
  line = (char *)0x0;
  pairs = (char **)0x0;
  tmp = (char **)0x0;
  ppcStack_38 = (char **)0x0;
  line_n._4_4_ = 0;
  a = 0;
  fp = (FILE *)ptr;
  line = (char *)malloc(0x800);
  if (line != (char *)0x0) {
    *line = '\0';
    buf = (char *)fopen("/proc/self/smaps","r");
    if ((FILE *)buf != (FILE *)0x0) {
      while (_Var2 = getline((char **)&pairs,&a,(FILE *)buf), _Var2 != -1) {
        iVar1 = __isoc99_sscanf(pairs,"%lx-%lx",&b,&local_58);
        if (((iVar1 == 2) && (b <= fp)) && (fp < local_58)) {
          strcat(line,"    ");
          strcat(line,(char *)pairs);
          while (_Var2 = getline((char **)&pairs,&a,(FILE *)buf), _Var2 != -1) {
            if (((*(char *)pairs < 'A') || ('Z' < *(char *)pairs)) ||
               (pcVar3 = strchr((char *)pairs,0x3a), pcVar3 == (char *)0x0)) {
              free(pairs);
              goto LAB_00314498;
            }
            ppcStack_38 = (char **)realloc(tmp,(ulong)(line_n._4_4_ + 1) << 3);
            if (ppcStack_38 == (char **)0x0) goto LAB_00314498;
            ppcStack_38[line_n._4_4_] = (char *)pairs;
            pairs = (char **)0x0;
            a = 0;
            line_n._4_4_ = line_n._4_4_ + 1;
            tmp = ppcStack_38;
          }
        }
      }
    }
  }
LAB_00314498:
  add_smaps(line,tmp,line_n._4_4_);
  free_pairs(tmp,line_n._4_4_);
  if (buf != (char *)0x0) {
    fclose((FILE *)buf);
  }
  return line;
}

Assistant:

char *
vma_info(void *ptr)
{
	FILE *fp = NULL;
	char *buf = NULL;
	char *line = NULL;
	char **pairs = NULL, **tmp = NULL;
	unsigned pairs_cnt = 0;
	size_t line_n = 0;
	buf = malloc(2048);
	if (!buf)
		goto done;
	buf[0] = 0;
	fp = fopen("/proc/self/smaps", "r");
	if (!fp)
		goto done;
	while (getline(&line, &line_n, fp) != -1) {
		unsigned long a, b;
		if (sscanf(line, "%lx-%lx", &a, &b) != 2)
			continue;
		if (a <= (unsigned long)ptr && (unsigned long)ptr < b) {
			/* OK, found it! */
			strcat(buf, "    ");
			strcat(buf, line);
			while (getline(&line, &line_n, fp) != -1) {
				if (line[0] >= 'A' && line[0] <= 'Z'
						&& strchr(line, ':') != NULL) {
					tmp = realloc(pairs, (pairs_cnt+1) * sizeof(char *));
					if (!tmp)
						goto done;
					pairs = tmp;
					pairs[pairs_cnt++] = line;
					line = NULL;
					line_n = 0;
				} else {
					free(line);
					goto done;
				}
			}
		}
	}
done:
	add_smaps(buf, pairs, pairs_cnt);
	free_pairs(pairs, pairs_cnt);
	if (fp)
		fclose(fp);
	return buf;
}